

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

ByteData *
cfd::core::TaprootUtil::CreateTapScriptControl
          (ByteData *__return_storage_ptr__,SchnorrPubkey *internal_pubkey,TapBranch *merkle_tree,
          SchnorrPubkey *witness_program,Script *locking_script)

{
  byte bVar1;
  pointer puVar2;
  bool bVar3;
  Script *this;
  byte bVar4;
  ByteData256 *node;
  ByteData256 *buffer;
  bool parity;
  Serializer builder;
  ByteData256 pubkey_data;
  bool local_b9;
  Script local_b8;
  Script *local_78;
  Serializer local_70;
  ByteData256 local_48;
  
  local_b9 = false;
  local_78 = locking_script;
  TapBranch::GetTweakedPubkey((SchnorrPubkey *)&local_b8,merkle_tree,internal_pubkey,&local_b9);
  SchnorrPubkey::GetByteData256(&local_48,(SchnorrPubkey *)&local_b8);
  if ((ByteData256 *)local_b8._vptr_Script != (ByteData256 *)0x0) {
    operator_delete(local_b8._vptr_Script);
  }
  bVar3 = local_b9;
  bVar1 = merkle_tree->leaf_version_;
  Serializer::Serializer(&local_70);
  bVar4 = 0xc0;
  if (bVar1 != 0) {
    bVar4 = bVar1;
  }
  Serializer::AddDirectByte(&local_70,bVar4 | bVar3);
  SchnorrPubkey::GetData((ByteData *)&local_b8,internal_pubkey);
  this = local_78;
  Serializer::AddDirectBytes(&local_70,(ByteData *)&local_b8);
  if ((ByteData256 *)local_b8._vptr_Script != (ByteData256 *)0x0) {
    operator_delete(local_b8._vptr_Script);
  }
  (*merkle_tree->_vptr_TapBranch[4])(&local_b8,merkle_tree);
  puVar2 = local_b8.script_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_b8._vptr_Script !=
      (_func_int **)
      local_b8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    buffer = (ByteData256 *)local_b8._vptr_Script;
    do {
      Serializer::AddDirectBytes(&local_70,buffer);
      buffer = buffer + 1;
    } while (buffer != (ByteData256 *)puVar2);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_b8);
  if (witness_program != (SchnorrPubkey *)0x0) {
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_b8,&local_48);
    puVar2 = (witness_program->data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (witness_program->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._vptr_Script;
    (witness_program->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b8.script_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (witness_program->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.script_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_b8._vptr_Script = (_func_int **)0x0;
    local_b8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    if ((ByteData256 *)local_b8._vptr_Script != (ByteData256 *)0x0) {
      operator_delete(local_b8._vptr_Script);
    }
  }
  if (this != (Script *)0x0) {
    ScriptUtil::CreateTaprootLockingScript(&local_b8,&local_48);
    Script::operator=(this,&local_b8);
    Script::~Script(&local_b8);
  }
  Serializer::Output(__return_storage_ptr__,&local_70);
  local_70._vptr_Serializer = (_func_int **)&PTR__Serializer_0025a828;
  if (local_70.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData TaprootUtil::CreateTapScriptControl(
    const SchnorrPubkey& internal_pubkey, const TapBranch& merkle_tree,
    SchnorrPubkey* witness_program, Script* locking_script) {
  bool parity = false;
  auto pubkey_data =
      merkle_tree.GetTweakedPubkey(internal_pubkey, &parity).GetByteData256();
  uint8_t top = merkle_tree.GetLeafVersion();
  if (top == 0) top = TaprootScriptTree::kTapScriptLeafVersion;
  if (parity) top |= 0x01;
  Serializer builder;
  builder.AddDirectByte(top);
  builder.AddDirectBytes(internal_pubkey.GetData());
  for (const auto& node : merkle_tree.GetNodeList()) {
    builder.AddDirectBytes(node);
  }
  if (witness_program != nullptr) {
    *witness_program = SchnorrPubkey(pubkey_data);
  }
  if (locking_script != nullptr) {
    *locking_script = ScriptUtil::CreateTaprootLockingScript(pubkey_data);
  }
  return builder.Output();
}